

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.cpp
# Opt level: O0

void __thiscall
polyscope::Structure::Structure(Structure *this,void **vtt,string *name_,string *subtypeName)

{
  mat<4,_4,_float,_(glm::qualifier)0> value_;
  string *name;
  undefined8 in_RCX;
  string *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [56];
  undefined1 in_stack_fffffffffffffc58 [64];
  undefined8 in_stack_fffffffffffffcc0;
  float value__00;
  string *in_stack_fffffffffffffcc8;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *Tpers_;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *in_stack_fffffffffffffcd0;
  PersistentValue<float> *this_00;
  string *name__00;
  TransformationGizmo *this_01;
  string *this_02;
  col_type in_stack_fffffffffffffd10;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [36];
  undefined4 local_134;
  undefined1 local_130 [64];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [80];
  undefined1 auVar3 [24];
  
  value__00 = (float)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
  auVar5 = in_stack_fffffffffffffc58._0_56_;
  render::ManagedBufferRegistry::ManagedBufferRegistry(in_stack_fffffffffffffc58._8_8_);
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = in_RSI[1];
  this_02 = (string *)(in_RDI + 0x28);
  std::__cxx11::string::string(this_02,in_RDX);
  this_01 = (TransformationGizmo *)(in_RDI + 0x2c);
  std::operator+(auVar5._48_8_,auVar5._40_8_);
  std::operator+(auVar5._16_8_,auVar5._8_8_);
  std::operator+(auVar5._16_8_,auVar5._8_8_);
  PersistentValue<bool>::PersistentValue
            ((PersistentValue<bool> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
             SUB41((uint)value__00 >> 0x18,0));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  auVar3 = auVar5._0_24_;
  name__00 = (string *)(in_RDI + 0x31);
  std::operator+(auVar5._48_8_,auVar5._40_8_);
  std::operator+(auVar3._16_8_,auVar3._8_8_);
  auVar2 = auVar3._0_16_;
  std::operator+(auVar3._16_8_,auVar3._8_8_);
  local_134 = 0x3f800000;
  glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(auVar2._8_8_,auVar2._0_8_);
  auVar1 = vmovdqu64_avx512f(local_130);
  auVar1 = vmovdqu64_avx512f(auVar1);
  auVar5 = auVar1._0_56_;
  value_.value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)in_RCX;
  value_.value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)(int)((ulong)in_RCX >> 0x20);
  value_.value[0]._0_8_ = this_01;
  value_.value[1]._0_8_ = in_RSI;
  value_.value[1]._8_8_ = in_RDI;
  value_.value[2]._0_8_ = in_RDX;
  value_.value[2]._8_8_ = this_02;
  value_.value[3] = in_stack_fffffffffffffd10;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::PersistentValue
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,value_);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  this_00 = (PersistentValue<float> *)(in_RDI + 0x3e);
  std::operator+(auVar5._48_8_,auVar5._40_8_);
  std::operator+(auVar5._16_8_,auVar5._8_8_);
  std::operator+(auVar5._16_8_,auVar5._8_8_);
  PersistentValue<float>::PersistentValue(this_00,in_stack_fffffffffffffcc8,value__00);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_198);
  Tpers_ = (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)(in_RDI + 0x43);
  std::operator+(auVar5._48_8_,auVar5._40_8_);
  std::operator+(auVar5._16_8_,auVar5._8_8_);
  std::operator+(auVar5._16_8_,auVar5._8_8_);
  name = (string *)
         PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
                   ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)(in_RDI + 0x31));
  TransformationGizmo::TransformationGizmo(this_01,name__00,(mat4 *)this_00,Tpers_);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  std::operator+(auVar5._48_8_,auVar5._40_8_);
  std::operator+(auVar5._16_8_,auVar5._8_8_);
  std::operator+(auVar5._16_8_,auVar5._8_8_);
  PersistentValue<bool>::PersistentValue
            ((PersistentValue<bool> *)this_00,&Tpers_->name,SUB81((ulong)name >> 0x38,0));
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_258);
  auVar4 = auVar5._0_32_;
  std::operator+(auVar5._48_8_,auVar5._40_8_);
  std::operator+(auVar4._16_8_,auVar4._8_8_);
  std::operator+(auVar4._16_8_,auVar4._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3c4126);
  PersistentValue<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::PersistentValue((PersistentValue<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)this_01,name__00,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
  auVar2 = auVar4._0_16_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(auVar4._24_8_);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_2b8);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&stack0xfffffffffffffd1c,-0x309,-0x309,-0x309);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&stack0xfffffffffffffd10,-0x309,-0x309,-0x309);
  std::tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>::
  tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_true>
            (auVar2._8_8_,auVar2._0_8_,(vec<3,_float,_(glm::qualifier)0> *)0x3c41d0);
  *(undefined4 *)(in_RDI + 0x77) = 0xc4424000;
  validateName(name);
  return;
}

Assistant:

Structure::Structure(std::string name_, std::string subtypeName)
    : name(name_), enabled(subtypeName + "#" + name + "#enabled", true),
      objectTransform(subtypeName + "#" + name + "#object_transform", glm::mat4(1.0)),
      transparency(subtypeName + "#" + name + "#transparency", 1.0),
      transformGizmo(subtypeName + "#" + name + "#transform_gizmo", objectTransform.get(), &objectTransform),
      cullWholeElements(subtypeName + "#" + name + "#cullWholeElements", false),
      ignoredSlicePlaneNames(subtypeName + "#" + name + "#ignored_slice_planes", {}),
      objectSpaceBoundingBox(
          std::tuple<glm::vec3, glm::vec3>{glm::vec3{-777, -777, -777}, glm::vec3{-777, -777, -777}}),
      objectSpaceLengthScale(-777) {
  validateName(name);
}